

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char> __thiscall
fmt::v11::detail::write_escaped_string<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,basic_string_view<char> str)

{
  size_t sVar1;
  anon_class_8_1_6971b95b_for_f f;
  ulong uVar2;
  buffer<char> *pbVar3;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_38;
  
  if (*(ulong *)(this + 0x10) < *(long *)(this + 8) + 1U) {
    (**(code **)(this + 0x18))(this,*(long *)(this + 8) + 1U,str.data_,str.size_);
  }
  f.result = *(find_escape_result<char> **)(this + 8);
  *(undefined1 **)(this + 8) = (undefined1 *)((long)&(f.result)->begin + 1);
  *(undefined1 *)((long)&(f.result)->begin + *(long *)this) = 0x22;
  pbVar3 = (buffer<char> *)(str.data_ + out.container);
  do {
    local_38.end = (char *)0x0;
    local_38.cp = 0;
    s.data_ = (char *)((long)pbVar3 - (long)out.container);
    s.size_ = (size_t)&local_38;
    local_38.begin = (char *)pbVar3;
    for_each_codepoint<fmt::v11::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v11::basic_string_view<char>)_1_>
              ((detail *)out.container,s,f);
    buffer<char>::append<char>((buffer<char> *)this,(char *)out.container,local_38.begin);
    out.container = (buffer<char> *)local_38.end;
    if ((buffer<char> *)local_38.end == (buffer<char> *)0x0) break;
    this = (detail *)
           write_escaped_cp<fmt::v11::basic_appender<char>,char>
                     ((basic_appender<char>)this,&local_38);
  } while (out.container != pbVar3);
  uVar2 = ((buffer<char> *)this)->size_ + 1;
  if (((buffer<char> *)this)->capacity_ < uVar2) {
    (*((buffer<char> *)this)->grow_)((buffer<char> *)this,uVar2);
  }
  sVar1 = ((buffer<char> *)this)->size_;
  ((buffer<char> *)this)->size_ = sVar1 + 1;
  ((buffer<char> *)this)->ptr_[sVar1] = '\"';
  return (basic_appender<char>)(buffer<char> *)this;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}